

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCall1(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments;
  SmallArray<ArgumentData,_1U> local_60;
  
  local_60.allocator = ctx->allocator;
  local_60.data = local_60.little;
  local_60.max = 1;
  local_60.little[0].source = arg0->source;
  local_60.little[0].type = arg0->type;
  local_60.count = 1;
  local_60.little[0].isExplicit = false;
  local_60.little[0].name = (SynIdentifier *)0x0;
  local_60.little[0].valueFunction = (FunctionData *)0x0;
  arguments._8_8_ = 1;
  arguments.data = local_60.data;
  local_60.little[0].value = arg0;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_1U>::~SmallArray(&local_60);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall1(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}